

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderBuiltinPrecisionTests.cpp
# Opt level: O3

IRet * __thiscall
vkt::shaderexecutor::Functions::OuterProduct<4,_3>::doApply
          (IRet *__return_storage_ptr__,OuterProduct<4,_3> *this,EvalContext *ctx,IArgs *iargs)

{
  Vector<tcu::Interval,_3> *pVVar1;
  Mul *pMVar2;
  long lVar3;
  bool *pbVar4;
  undefined1 local_8a;
  undefined1 local_89;
  IRet *local_88;
  long local_80;
  long local_78;
  Interval *local_70;
  bool *local_68;
  bool *local_60;
  undefined1 *local_58;
  undefined1 *local_50;
  undefined8 local_48;
  double dStack_40;
  undefined8 local_38;
  
  tcu::Matrix<tcu::Interval,_4,_3>::Matrix(__return_storage_ptr__);
  local_80 = 0;
  local_88 = __return_storage_ptr__;
  do {
    local_78 = local_80 * 0x18;
    lVar3 = 0;
    local_70 = (Interval *)__return_storage_ptr__;
    do {
      pbVar4 = &iargs->a->m_data[0].m_hasNaN + local_78;
      pVVar1 = iargs->b;
      pMVar2 = instance<vkt::shaderexecutor::Functions::Mul>();
      local_50 = &local_8a;
      local_68 = pbVar4;
      local_60 = &pVVar1->m_data[0].m_hasNaN + lVar3;
      local_58 = &local_89;
      (**(code **)((long)*pMVar2 + 0x40))(&local_48,pMVar2,ctx,&local_68);
      *(undefined8 *)((long)&local_70->m_hi + lVar3 * 4) = local_38;
      pbVar4 = &((Vector<tcu::Vector<tcu::Interval,_4>,_3> *)&local_70->m_hasNaN)->m_data[0].m_data
                [0].m_hasNaN + lVar3 * 4;
      *(undefined8 *)pbVar4 = local_48;
      *(double *)(pbVar4 + 8) = dStack_40;
      lVar3 = lVar3 + 0x18;
    } while (lVar3 != 0x48);
    local_80 = local_80 + 1;
    __return_storage_ptr__ = (IRet *)(local_70 + 1);
  } while (local_80 != 4);
  return local_88;
}

Assistant:

IRet	doApply	(const EvalContext& ctx, const IArgs& iargs) const
	{
		IRet	ret;

		for (int row = 0; row < Rows; ++row)
		{
			for (int col = 0; col < Cols; ++col)
				ret[col][row] = call<Mul>(ctx, iargs.a[row], iargs.b[col]);
		}

		return ret;
	}